

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vl53lxx.cpp
# Opt level: O0

void __thiscall VL53LXX::powerOn(VL53LXX *this)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  runtime_error *this_00;
  allocator local_269;
  string local_268 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248 [48];
  ostream local_218 [8];
  ofstream file;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> guard;
  VL53LXX *this_local;
  
  guard._M_device = (mutex_type *)this;
  initGPIO(this);
  if (-1 < this->xshutGPIOPin) {
    std::lock_guard<std::mutex>::lock_guard(&local_18,&this->fileAccessMutex);
    std::ofstream::ofstream(local_218);
    _Var2 = std::__cxx11::string::c_str();
    std::ofstream::open((char *)local_218,_Var2);
    bVar1 = std::ofstream::is_open();
    if (((bVar1 & 1) == 0) || (bVar1 = std::ios::good(), (bVar1 & 1) == 0)) {
      std::ofstream::close();
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_268,"Failed opening file: ",&local_269);
      std::operator+(local_248,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268)
      ;
      std::runtime_error::runtime_error(this_00,(string *)local_248);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::operator<<(local_218,"1");
    std::ofstream::close();
    usleep(2000);
    std::ofstream::~ofstream(local_218);
    std::lock_guard<std::mutex>::~lock_guard(&local_18);
  }
  return;
}

Assistant:

void VL53LXX::powerOn() {
	this->initGPIO();

	if (this->xshutGPIOPin >= 0) {
		std::lock_guard<std::mutex> guard(this->fileAccessMutex);
		std::ofstream file;

		file.open(this->gpioFilename.c_str(), std::ofstream::out);
		if (!file.is_open() || !file.good()) {
			file.close();
			throw(std::runtime_error(std::string("Failed opening file: ") + this->gpioFilename));
		}
		file << "1";
		file.close();

		// t_boot is 1.2ms max, wait 2ms just to be sure
		usleep(2000);
	}
}